

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctreeBuilder.cpp
# Opt level: O2

void __thiscall OctreeBuilder::create_buffers(OctreeBuilder *this,shared_ptr<myvk::Device> *device)

{
  VkDeviceSize VVar1;
  undefined8 *puVar2;
  element_type *peVar3;
  uint uVar4;
  __shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2> local_48;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> local_38;
  uint local_1c;
  
  local_38.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::Buffer::Create((Buffer *)&local_48,device,8,0,0x22,VMA_MEMORY_USAGE_AUTO,&local_38);
  std::__shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_build_info_buffer).
              super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            (&local_38);
  local_38.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::Buffer::Create((Buffer *)&local_48,device,8,0x404,1,VMA_MEMORY_USAGE_AUTO,&local_38);
  *(undefined8 *)(local_48._M_ptr)->m_mapped_ptr = 0x800000000;
  std::__shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_build_info_staging_buffer).
              super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            (&local_38);
  local_38.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::Buffer::Create((Buffer *)&local_48,device,0xc,0,0x122,VMA_MEMORY_USAGE_AUTO,&local_38);
  std::__shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_indirect_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>
             ,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            (&local_38);
  local_38.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::Buffer::Create((Buffer *)&local_48,device,0xc,0x404,1,VMA_MEMORY_USAGE_AUTO,&local_38);
  puVar2 = (undefined8 *)(local_48._M_ptr)->m_mapped_ptr;
  *puVar2 = 0x100000001;
  *(undefined4 *)(puVar2 + 1) = 1;
  std::__shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_indirect_staging_buffer).
              super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            (&local_38);
  peVar3 = (this->m_voxelizer_ptr).super___shared_ptr<Voxelizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar4 = (peVar3->m_level / 3) * peVar3->m_voxel_fragment_count;
  local_1c = 1000000;
  if (1000000 < uVar4) {
    local_1c = uVar4;
  }
  if (499999999 < local_1c) {
    local_1c = 500000000;
  }
  local_38.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::Buffer::Create
            ((Buffer *)&local_48,device,(ulong)(local_1c << 2),0,0x20,VMA_MEMORY_USAGE_AUTO,
             &local_38);
  std::__shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_octree_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>,
             &local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            (&local_38);
  VVar1 = (((this->m_octree_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->super_BufferBase).m_size;
  local_38.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((((double)CONCAT44(0x45300000,(int)(VVar1 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)VVar1) - 4503599627370496.0)) / 1000000.0);
  spdlog::info<char[44],unsigned_int&,double>
            ((char (*) [44])"Octree buffer created with {} nodes ({} MB)",&local_1c,
             (double *)&local_38);
  return;
}

Assistant:

void OctreeBuilder::create_buffers(const std::shared_ptr<myvk::Device> &device) {
	m_build_info_buffer = myvk::Buffer::Create(device, 2 * sizeof(uint32_t), 0,
	                                           VK_BUFFER_USAGE_STORAGE_BUFFER_BIT | VK_BUFFER_USAGE_TRANSFER_DST_BIT);
	m_build_info_staging_buffer = myvk::Buffer::CreateStaging<uint32_t>(device, 2, [](uint32_t *data) {
		data[0] = 0; // uAllocBegin
		data[1] = 8; // uAllocNum
	});

	m_indirect_buffer = myvk::Buffer::Create(device, 3 * sizeof(uint32_t), 0,
	                                         VK_BUFFER_USAGE_STORAGE_BUFFER_BIT | VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT |
	                                             VK_BUFFER_USAGE_TRANSFER_DST_BIT);
	m_indirect_staging_buffer = myvk::Buffer::CreateStaging<uint32_t>(device, 3, [](uint32_t *data) {
		data[0] = 1; // uGroupX
		data[1] = 1; // uGroupY
		data[2] = 1; // uGroupZ
	});

	// Estimate octree buffer size
	uint32_t octree_node_ratio = m_voxelizer_ptr->GetLevel() / 3;
	uint32_t octree_entry_num =
	    std::max(kOctreeNodeNumMin, m_voxelizer_ptr->GetVoxelFragmentCount() * octree_node_ratio);
	octree_entry_num = std::min(octree_entry_num, kOctreeNodeNumMax);

	m_octree_buffer =
	    myvk::Buffer::Create(device, octree_entry_num * sizeof(uint32_t), 0, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT);
	spdlog::info("Octree buffer created with {} nodes ({} MB)", octree_entry_num,
	             m_octree_buffer->GetSize() / 1000000.0);
}